

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

int defragmentPage(MemPage *pPage,int nMaxFrag)

{
  u8 *puVar1;
  ushort uVar2;
  u16 uVar3;
  ushort uVar4;
  ushort uVar5;
  ushort uVar6;
  int iVar7;
  uint uVar8;
  ushort *puVar9;
  ushort uVar10;
  uint uVar11;
  uint uVar12;
  ulong uVar13;
  uint uVar14;
  ulong uVar15;
  uint uVar16;
  uint uVar17;
  u8 *local_78;
  uint local_70;
  u8 *local_48;
  
  puVar1 = pPage->aData;
  uVar13 = (ulong)pPage->hdrOffset;
  uVar10 = pPage->cellOffset;
  uVar5 = pPage->nCell;
  uVar14 = (uint)uVar10 + (uint)uVar5 * 2;
  uVar11 = pPage->pBt->usableSize;
  if (nMaxFrag < (int)(uint)puVar1[uVar13 + 7]) {
LAB_00172650:
    local_70 = uVar11 - 4;
    local_48 = (u8 *)0x0;
    local_78 = puVar1;
    uVar8 = uVar11;
    for (uVar15 = 0; uVar5 != uVar15; uVar15 = uVar15 + 1) {
      uVar2 = *(ushort *)(puVar1 + uVar15 * 2 + (ulong)uVar10) << 8 |
              *(ushort *)(puVar1 + uVar15 * 2 + (ulong)uVar10) >> 8;
      if ((uVar2 < uVar14) ||
         (uVar17 = (uint)uVar2, uVar17 != local_70 && (int)local_70 <= (int)(uint)uVar2)) {
        iVar7 = 0xfce4;
        goto LAB_00172813;
      }
      uVar3 = (*pPage->xCellSize)(pPage,local_78 + uVar17);
      uVar16 = uVar8 - uVar3;
      if (((int)uVar16 < (int)uVar14) || ((int)uVar11 < (int)((uint)uVar3 + (uint)uVar2))) {
        iVar7 = 0xfcea;
        goto LAB_00172813;
      }
      *(ushort *)(puVar1 + uVar15 * 2 + (ulong)uVar10) = (ushort)uVar16 << 8 | (ushort)uVar16 >> 8;
      if (local_48 == (u8 *)0x0) {
        if (uVar16 != uVar17) {
          local_78 = (u8 *)pPage->pBt->pPager->pTmpSpace;
          uVar2 = *(ushort *)(puVar1 + uVar13 + 5) << 8 | *(ushort *)(puVar1 + uVar13 + 5) >> 8;
          memcpy(local_78 + uVar2,puVar1 + uVar2,(long)(int)(uVar8 - uVar2));
          local_48 = local_78;
          goto LAB_00172747;
        }
        local_48 = (u8 *)0x0;
      }
      else {
LAB_00172747:
        memcpy(puVar1 + uVar16,local_78 + uVar17,(ulong)uVar3);
      }
      uVar8 = uVar16;
    }
    puVar1[uVar13 + 7] = '\0';
    uVar11 = 0;
  }
  else {
    uVar2 = *(ushort *)(puVar1 + uVar13 + 1) << 8 | *(ushort *)(puVar1 + uVar13 + 1) >> 8;
    if ((int)(uVar11 - 4) < (int)(uint)uVar2) {
      iVar7 = 0xfcb4;
      goto LAB_00172813;
    }
    uVar17 = (uint)uVar2;
    if (uVar2 == 0) goto LAB_00172650;
    uVar4 = *(ushort *)(puVar1 + uVar2) << 8 | *(ushort *)(puVar1 + uVar2) >> 8;
    if (uVar11 - 4 < (uint)uVar4) {
      iVar7 = 0xfcb7;
      goto LAB_00172813;
    }
    if ((uVar4 != 0) && ((puVar1[uVar4] != '\0' || (puVar1[(ulong)uVar4 + 1] != '\0'))))
    goto LAB_00172650;
    uVar5 = *(ushort *)(puVar1 + uVar13 + 5) << 8 | *(ushort *)(puVar1 + uVar13 + 5) >> 8;
    iVar7 = uVar17 - uVar5;
    if (uVar17 < uVar5 || iVar7 == 0) {
      iVar7 = 0xfcbf;
      goto LAB_00172813;
    }
    uVar6 = *(ushort *)(puVar1 + (ulong)uVar2 + 2) << 8 |
            *(ushort *)(puVar1 + (ulong)uVar2 + 2) >> 8;
    uVar16 = (uint)uVar6;
    uVar8 = (uint)uVar6 + (uint)uVar2;
    if (uVar4 == 0) {
      uVar12 = 0;
      if ((int)uVar11 < (int)uVar8) {
        iVar7 = 0xfcc8;
        goto LAB_00172813;
      }
    }
    else {
      if (uVar4 < uVar8) {
        iVar7 = 0xfcc2;
        goto LAB_00172813;
      }
      uVar2 = *(ushort *)(puVar1 + (ulong)uVar4 + 2) << 8 |
              *(ushort *)(puVar1 + (ulong)uVar4 + 2) >> 8;
      if ((int)uVar11 < (int)((uint)uVar2 + (uint)uVar4)) {
        iVar7 = 0xfcc4;
        goto LAB_00172813;
      }
      memmove(puVar1 + (uVar2 + uVar8),puVar1 + uVar8,(long)(int)(uVar4 - uVar8));
      uVar12 = (uint)uVar2;
      uVar16 = uVar6 + uVar12;
    }
    uVar8 = uVar16 + uVar5;
    memmove(puVar1 + uVar8,puVar1 + (uint)uVar5,(long)iVar7);
    for (puVar9 = (ushort *)(puVar1 + uVar10); puVar9 < puVar1 + uVar14; puVar9 = puVar9 + 1) {
      uVar10 = *puVar9 << 8 | *puVar9 >> 8;
      uVar11 = uVar16;
      if ((uVar10 < uVar17) || (uVar11 = uVar12, (uint)uVar10 < (uint)uVar4)) {
        uVar10 = uVar10 + (short)uVar11;
        *puVar9 = uVar10 * 0x100 | uVar10 >> 8;
      }
    }
    uVar11 = (uint)puVar1[uVar13 + 7];
  }
  if (uVar11 + (uVar8 - uVar14) == pPage->nFree) {
    *(ushort *)(puVar1 + uVar13 + 5) = (ushort)uVar8 << 8 | (ushort)uVar8 >> 8;
    (puVar1 + uVar13 + 1)[0] = '\0';
    (puVar1 + uVar13 + 1)[1] = '\0';
    memset(puVar1 + uVar14,0,(long)(int)(uVar8 - uVar14));
    return 0;
  }
  iVar7 = 0xfcff;
LAB_00172813:
  iVar7 = sqlite3CorruptError(iVar7);
  return iVar7;
}

Assistant:

static int defragmentPage(MemPage *pPage, int nMaxFrag){
  int i;                     /* Loop counter */
  int pc;                    /* Address of the i-th cell */
  int hdr;                   /* Offset to the page header */
  int size;                  /* Size of a cell */
  int usableSize;            /* Number of usable bytes on a page */
  int cellOffset;            /* Offset to the cell pointer array */
  int cbrk;                  /* Offset to the cell content area */
  int nCell;                 /* Number of cells on the page */
  unsigned char *data;       /* The page data */
  unsigned char *temp;       /* Temp area for cell content */
  unsigned char *src;        /* Source of content */
  int iCellFirst;            /* First allowable cell index */
  int iCellLast;             /* Last possible cell index */

  assert( sqlite3PagerIswriteable(pPage->pDbPage) );
  assert( pPage->pBt!=0 );
  assert( pPage->pBt->usableSize <= SQLITE_MAX_PAGE_SIZE );
  assert( pPage->nOverflow==0 );
  assert( sqlite3_mutex_held(pPage->pBt->mutex) );
  temp = 0;
  src = data = pPage->aData;
  hdr = pPage->hdrOffset;
  cellOffset = pPage->cellOffset;
  nCell = pPage->nCell;
  assert( nCell==get2byte(&data[hdr+3]) || CORRUPT_DB );
  iCellFirst = cellOffset + 2*nCell;
  usableSize = pPage->pBt->usableSize;

  /* This block handles pages with two or fewer free blocks and nMaxFrag
  ** or fewer fragmented bytes. In this case it is faster to move the
  ** two (or one) blocks of cells using memmove() and add the required
  ** offsets to each pointer in the cell-pointer array than it is to 
  ** reconstruct the entire page.  */
  if( (int)data[hdr+7]<=nMaxFrag ){
    int iFree = get2byte(&data[hdr+1]);
    if( iFree>usableSize-4 ) return SQLITE_CORRUPT_PAGE(pPage);
    if( iFree ){
      int iFree2 = get2byte(&data[iFree]);
      if( iFree2>usableSize-4 ) return SQLITE_CORRUPT_PAGE(pPage);
      if( 0==iFree2 || (data[iFree2]==0 && data[iFree2+1]==0) ){
        u8 *pEnd = &data[cellOffset + nCell*2];
        u8 *pAddr;
        int sz2 = 0;
        int sz = get2byte(&data[iFree+2]);
        int top = get2byte(&data[hdr+5]);
        if( top>=iFree ){
          return SQLITE_CORRUPT_PAGE(pPage);
        }
        if( iFree2 ){
          if( iFree+sz>iFree2 ) return SQLITE_CORRUPT_PAGE(pPage);
          sz2 = get2byte(&data[iFree2+2]);
          if( iFree2+sz2 > usableSize ) return SQLITE_CORRUPT_PAGE(pPage);
          memmove(&data[iFree+sz+sz2], &data[iFree+sz], iFree2-(iFree+sz));
          sz += sz2;
        }else if( iFree+sz>usableSize ){
          return SQLITE_CORRUPT_PAGE(pPage);
        }

        cbrk = top+sz;
        assert( cbrk+(iFree-top) <= usableSize );
        memmove(&data[cbrk], &data[top], iFree-top);
        for(pAddr=&data[cellOffset]; pAddr<pEnd; pAddr+=2){
          pc = get2byte(pAddr);
          if( pc<iFree ){ put2byte(pAddr, pc+sz); }
          else if( pc<iFree2 ){ put2byte(pAddr, pc+sz2); }
        }
        goto defragment_out;
      }
    }
  }

  cbrk = usableSize;
  iCellLast = usableSize - 4;
  for(i=0; i<nCell; i++){
    u8 *pAddr;     /* The i-th cell pointer */
    pAddr = &data[cellOffset + i*2];
    pc = get2byte(pAddr);
    testcase( pc==iCellFirst );
    testcase( pc==iCellLast );
    /* These conditions have already been verified in btreeInitPage()
    ** if PRAGMA cell_size_check=ON.
    */
    if( pc<iCellFirst || pc>iCellLast ){
      return SQLITE_CORRUPT_PAGE(pPage);
    }
    assert( pc>=iCellFirst && pc<=iCellLast );
    size = pPage->xCellSize(pPage, &src[pc]);
    cbrk -= size;
    if( cbrk<iCellFirst || pc+size>usableSize ){
      return SQLITE_CORRUPT_PAGE(pPage);
    }
    assert( cbrk+size<=usableSize && cbrk>=iCellFirst );
    testcase( cbrk+size==usableSize );
    testcase( pc+size==usableSize );
    put2byte(pAddr, cbrk);
    if( temp==0 ){
      int x;
      if( cbrk==pc ) continue;
      temp = sqlite3PagerTempSpace(pPage->pBt->pPager);
      x = get2byte(&data[hdr+5]);
      memcpy(&temp[x], &data[x], (cbrk+size) - x);
      src = temp;
    }
    memcpy(&data[cbrk], &src[pc], size);
  }
  data[hdr+7] = 0;

 defragment_out:
  assert( pPage->nFree>=0 );
  if( data[hdr+7]+cbrk-iCellFirst!=pPage->nFree ){
    return SQLITE_CORRUPT_PAGE(pPage);
  }
  assert( cbrk>=iCellFirst );
  put2byte(&data[hdr+5], cbrk);
  data[hdr+1] = 0;
  data[hdr+2] = 0;
  memset(&data[iCellFirst], 0, cbrk-iCellFirst);
  assert( sqlite3PagerIswriteable(pPage->pDbPage) );
  return SQLITE_OK;
}